

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_subOne_ivec2(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<int,_2> res;
  Vector<int,_2> res_1;
  Vector<float,_2> res_2;
  float local_18 [4];
  int local_8 [2];
  
  local_18[0] = c->in[0].m_data[3];
  local_18[1] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = (int)local_18[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = res.m_data[lVar1] + -1;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_2.m_data[lVar1] = (float)res_1.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_8[0] = 1;
  local_8[1] = 2;
  lVar1 = 0;
  do {
    (c->color).m_data[local_8[lVar1]] = res_2.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }